

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetFarRect
          (ON_Viewport *this,ON_3dPoint *left_bottom,ON_3dPoint *right_bottom,ON_3dPoint *left_top,
          ON_3dPoint *right_top)

{
  byte bVar1;
  bool bVar2;
  double local_168;
  ON_3dPoint local_140;
  ON_3dPoint local_128;
  ON_3dPoint local_110;
  ON_3dPoint local_f8;
  double local_e0;
  double y;
  double x;
  double s;
  byte local_b1;
  undefined1 local_b0 [7];
  bool rc;
  ON_Plane far_plane;
  ON_3dPoint *right_top_local;
  ON_3dPoint *left_top_local;
  ON_3dPoint *right_bottom_local;
  ON_3dPoint *left_bottom_local;
  ON_Viewport *this_local;
  
  far_plane.plane_equation.d = (double)right_top;
  ON_Plane::ON_Plane((ON_Plane *)local_b0);
  local_b1 = GetFarPlane(this,(ON_Plane *)local_b0);
  if ((bool)local_b1) {
    bVar2 = IsPerspectiveProjection(this);
    if (bVar2) {
      local_168 = this->m_frus_far / this->m_frus_near;
    }
    else {
      local_168 = 1.0;
    }
    x = local_168;
    y = 1.0;
    local_e0 = 1.0;
    GetViewScale(this,&y,&local_e0);
    y = 1.0 / y;
    local_e0 = 1.0 / local_e0;
    ON_Plane::PointAt(&local_f8,(ON_Plane *)local_b0,x * y * this->m_frus_left,
                      x * local_e0 * this->m_frus_bottom);
    left_bottom->z = local_f8.z;
    left_bottom->x = local_f8.x;
    left_bottom->y = local_f8.y;
    ON_Plane::PointAt(&local_110,(ON_Plane *)local_b0,x * y * this->m_frus_right,
                      x * local_e0 * this->m_frus_bottom);
    right_bottom->z = local_110.z;
    right_bottom->x = local_110.x;
    right_bottom->y = local_110.y;
    ON_Plane::PointAt(&local_128,(ON_Plane *)local_b0,x * y * this->m_frus_left,
                      x * local_e0 * this->m_frus_top);
    left_top->z = local_128.z;
    left_top->x = local_128.x;
    left_top->y = local_128.y;
    ON_Plane::PointAt(&local_140,(ON_Plane *)local_b0,x * y * this->m_frus_right,
                      x * local_e0 * this->m_frus_top);
    *(double *)far_plane.plane_equation.d = local_140.x;
    *(double *)((long)far_plane.plane_equation.d + 8) = local_140.y;
    *(double *)((long)far_plane.plane_equation.d + 0x10) = local_140.z;
  }
  bVar1 = local_b1;
  ON_Plane::~ON_Plane((ON_Plane *)local_b0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_Viewport::GetFarRect( 
       ON_3dPoint& left_bottom,
       ON_3dPoint& right_bottom,
       ON_3dPoint& left_top,
       ON_3dPoint& right_top
       ) const
{
  ON_Plane far_plane;
  bool rc = GetFarPlane( far_plane );
  if (rc )
  {
    double s = IsPerspectiveProjection()
            ? m_frus_far/m_frus_near
            : 1.0;
    double x = 1.0, y = 1.0;
    GetViewScale(&x,&y);
    x = 1.0/x;
    y = 1.0/y;
    left_bottom  = far_plane.PointAt( s*x*m_frus_left,  s*y*m_frus_bottom );
    right_bottom = far_plane.PointAt( s*x*m_frus_right, s*y*m_frus_bottom );
    left_top     = far_plane.PointAt( s*x*m_frus_left,  s*y*m_frus_top );
    right_top    = far_plane.PointAt( s*x*m_frus_right, s*y*m_frus_top );
  }
  return rc;
}